

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFCopyDescriptor.cpp
# Opt level: O1

void amrex::InterpFillFab
               (MultiFabCopyDescriptor *fabCopyDesc,
               Vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_> *fillBoxIds,
               MultiFabId faid1,MultiFabId faid2,FArrayBox *dest,Real t1,Real t2,Real t,int src_comp
               ,int dest_comp,int num_comp,bool extrap)

{
  Box *b;
  FillBoxId *fillboxid;
  double dVar1;
  double local_c8;
  FArrayBox dest2;
  FArrayBox dest1;
  
  dVar1 = (t2 - t1) / 1000.0;
  if ((t < t1 - dVar1) || (dVar1 + t1 < t)) {
    if ((t <= t2 - dVar1) || (dVar1 + t2 <= t)) {
      b = &(dest->super_BaseFab<double>).domain;
      FArrayBox::FArrayBox(&dest1,b,(dest->super_BaseFab<double>).nvar,true,false,(Arena *)0x0);
      dest2.super_BaseFab<double>._vptr_BaseFab = (_func_int **)0x7ff8000000000000;
      BaseFab<double>::setVal<(amrex::RunOn)1>
                (&dest1.super_BaseFab<double>,(double *)&dest2,&dest1.super_BaseFab<double>.domain,
                 (DestComp)0x0,(NumComps)dest1.super_BaseFab<double>.nvar);
      FArrayBox::FArrayBox(&dest2,b,(dest->super_BaseFab<double>).nvar,true,false,(Arena *)0x0);
      local_c8 = NAN;
      BaseFab<double>::setVal<(amrex::RunOn)1>
                (&dest2.super_BaseFab<double>,&local_c8,&dest2.super_BaseFab<double>.domain,
                 (DestComp)0x0,(NumComps)dest2.super_BaseFab<double>.nvar);
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                (&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                 (FabArrayId)faid1.fabArrayId,
                 (fillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                 super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
                 super__Vector_impl_data._M_start,&dest1);
      FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
                (&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
                 (FabArrayId)faid2.fabArrayId,
                 (fillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                 super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
                 super__Vector_impl_data._M_start + 1,&dest2);
      BaseFab<double>::linInterp<(amrex::RunOn)1>
                (&dest->super_BaseFab<double>,&dest1.super_BaseFab<double>,src_comp,
                 &dest2.super_BaseFab<double>,src_comp,t1,t2,t,b,dest_comp,num_comp);
      dest2.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      BaseFab<double>::clear(&dest2.super_BaseFab<double>);
      dest1.super_BaseFab<double>._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
      BaseFab<double>::clear(&dest1.super_BaseFab<double>);
      return;
    }
    fillboxid = (fillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
                super__Vector_impl_data._M_start;
    faid1.fabArrayId = faid2.fabArrayId;
  }
  else {
    fillboxid = (fillBoxIds->super_vector<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>).
                super__Vector_base<amrex::FillBoxId,_std::allocator<amrex::FillBoxId>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
            (&fabCopyDesc->super_FabArrayCopyDescriptor<amrex::FArrayBox>,
             (FabArrayId)faid1.fabArrayId,fillboxid,dest);
  return;
}

Assistant:

void
InterpFillFab (MultiFabCopyDescriptor& fabCopyDesc,
               const Vector<FillBoxId>& fillBoxIds,
               MultiFabId              faid1,
               MultiFabId              faid2,
               FArrayBox&              dest,
               Real                    t1,
               Real                    t2,
               Real                    t,
               int                     src_comp,   // these comps need to be removed
               int                     dest_comp,  // from this routine
               int                     num_comp,
               bool                    extrap)
{
    amrex::ignore_unused(extrap);

    const Real teps = (t2-t1)/1000.0_rt;

    BL_ASSERT(extrap || ( (t>=t1-teps) && (t <= t2+teps) ) );

    if (t >= t1-teps && t <= t1+teps)
    {
        fabCopyDesc.FillFab(faid1, fillBoxIds[0], dest);
    }
    else if (t > t2-teps && t < t2+teps)
    {
        fabCopyDesc.FillFab(faid2, fillBoxIds[0], dest);
    }
    else
    {
        BL_ASSERT(dest_comp + num_comp <= dest.nComp());

        FArrayBox dest1(dest.box(), dest.nComp());
        dest1.setVal<RunOn::Host>(std::numeric_limits<Real>::quiet_NaN());
        FArrayBox dest2(dest.box(), dest.nComp());
        dest2.setVal<RunOn::Host>(std::numeric_limits<Real>::quiet_NaN());
        fabCopyDesc.FillFab(faid1, fillBoxIds[0], dest1);
        fabCopyDesc.FillFab(faid2, fillBoxIds[1], dest2);
        dest.linInterp<RunOn::Host>
                      (dest1,
                       src_comp,
                       dest2,
                       src_comp,
                       t1,
                       t2,
                       t,
                       dest.box(),
                       dest_comp,
                       num_comp);
    }
}